

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O1

void prvTidyFreeTags(TidyDocImpl *doc)

{
  _DictHash *p_Var1;
  Dict *pDVar2;
  DictHash *pDVar3;
  uint i;
  long lVar4;
  
  lVar4 = 0;
  do {
    pDVar3 = (doc->tags).hashtab[lVar4];
    while (pDVar3 != (DictHash *)0x0) {
      p_Var1 = pDVar3->next;
      (*doc->allocator->vtbl->free)(doc->allocator,pDVar3);
      pDVar3 = p_Var1;
    }
    (doc->tags).hashtab[lVar4] = (DictHash *)0x0;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xb2);
  prvTidyFreeDeclaredTags(doc,tagtype_null);
  pDVar2 = (doc->tags).xml_tags;
  if (pDVar2 != (Dict *)0x0) {
    (*doc->allocator->vtbl->free)(doc->allocator,pDVar2->name);
  }
  (*doc->allocator->vtbl->free)(doc->allocator,pDVar2);
  memset(&doc->tags,0,0x5a0);
  return;
}

Assistant:

void TY_(FreeTags)( TidyDocImpl* doc )
{
    TidyTagImpl* tags = &doc->tags;

#if ELEMENT_HASH_LOOKUP
    tagsEmptyHash( doc, tags );
#endif
    TY_(FreeDeclaredTags)( doc, tagtype_null );
    FreeDict( doc, tags->xml_tags );

    /* get rid of dangling tag references */
    TidyClearMemory( tags, sizeof(TidyTagImpl) );
}